

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int evp_pkey_name2type(char *name)

{
  int iVar1;
  char *in_RDI;
  size_t i;
  int type;
  ulong local_20;
  int local_4;
  
  local_20 = 0;
  while( true ) {
    if (0xb < local_20) {
      iVar1 = OBJ_sn2nid(in_RDI);
      local_4 = EVP_PKEY_type(iVar1);
      if (local_4 == 0) {
        iVar1 = OBJ_ln2nid(in_RDI);
        local_4 = EVP_PKEY_type(iVar1);
      }
      return local_4;
    }
    iVar1 = strcasecmp(in_RDI,(char *)standard_name2type[local_20].ptr);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return standard_name2type[local_20].id;
}

Assistant:

int evp_pkey_name2type(const char *name)
{
    int type;
    size_t i;

    for (i = 0; i < OSSL_NELEM(standard_name2type); i++) {
        if (strcasecmp(name, standard_name2type[i].ptr) == 0)
            return (int)standard_name2type[i].id;
    }

    if ((type = EVP_PKEY_type(OBJ_sn2nid(name))) != NID_undef)
        return type;
    return EVP_PKEY_type(OBJ_ln2nid(name));
}